

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCII85Decoder.cc
# Opt level: O0

ssize_t __thiscall Pl_ASCII85Decoder::write(Pl_ASCII85Decoder *this,int __fd,void *__buf,size_t __n)

{
  uchar uVar1;
  size_t sVar2;
  runtime_error *prVar3;
  Pipeline *pPVar4;
  undefined4 in_register_00000034;
  long lVar5;
  undefined1 local_38 [8];
  uchar zeroes [4];
  Pl_ASCII85Decoder *local_28;
  size_t i;
  size_t len_local;
  uchar *buf_local;
  Pl_ASCII85Decoder *this_local;
  
  lVar5 = CONCAT44(in_register_00000034,__fd);
  local_28 = this;
  if (this->eod < 2) {
    for (local_28 = (Pl_ASCII85Decoder *)0x0; local_28 < __buf;
        local_28 = (Pl_ASCII85Decoder *)((long)&(local_28->super_Pipeline)._vptr_Pipeline + 1)) {
      if ((local_28->inbuf[lVar5 + -0x30] - 9 < 5) || (local_28->inbuf[lVar5 + -0x30] == 0x20)) {
        QTC::TC("libtests","Pl_ASCII85Decoder ignore space",0);
      }
      else {
        if (1 < this->eod) {
          return (ssize_t)this;
        }
        if (this->eod == 1) {
          if (local_28->inbuf[lVar5 + -0x30] != '>') {
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar3,"broken end-of-data sequence in base 85 data");
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          flush(this);
          this->eod = 2;
        }
        else if (local_28->inbuf[lVar5 + -0x30] == 'z') {
          if (this->pos != 0) {
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar3,"unexpected z during base 85 decode");
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          QTC::TC("libtests","Pl_ASCII85Decoder read z",0);
          memset(local_38,0,4);
          pPVar4 = Pipeline::next(&this->super_Pipeline);
          (*pPVar4->_vptr_Pipeline[2])(pPVar4,local_38,4);
        }
        else if (local_28->inbuf[lVar5 + -0x30] == '~') {
          this->eod = 1;
        }
        else {
          if ((local_28->inbuf[lVar5 + -0x30] < 0x21) || (0x75 < local_28->inbuf[lVar5 + -0x30])) {
            this->error = true;
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar3,"character out of range during base 85 decode")
            ;
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar1 = local_28->inbuf[lVar5 + -0x30];
          sVar2 = this->pos;
          this->pos = sVar2 + 1;
          this->inbuf[sVar2] = uVar1;
          if (this->pos == 5) {
            flush(this);
          }
        }
      }
    }
  }
  return (ssize_t)local_28;
}

Assistant:

void
Pl_ASCII85Decoder::write(unsigned char const* buf, size_t len)
{
    if (eod > 1) {
        return;
    }
    for (size_t i = 0; i < len; ++i) {
        switch (buf[i]) {
        case ' ':
        case '\f':
        case '\v':
        case '\t':
        case '\r':
        case '\n':
            QTC::TC("libtests", "Pl_ASCII85Decoder ignore space");
            // ignore whitespace
            continue;
        }
        if (eod > 1) {
            break;
        } else if (eod == 1) {
            if (buf[i] == '>') {
                flush();
                eod = 2;
            } else {
                throw std::runtime_error("broken end-of-data sequence in base 85 data");
            }
        } else {
            switch (buf[i]) {
            case '~':
                eod = 1;
                break;

            case 'z':
                if (pos != 0) {
                    throw std::runtime_error("unexpected z during base 85 decode");
                } else {
                    QTC::TC("libtests", "Pl_ASCII85Decoder read z");
                    unsigned char zeroes[4];
                    memset(zeroes, '\0', 4);
                    next()->write(zeroes, 4);
                }
                break;

            default:
                if ((buf[i] < 33) || (buf[i] > 117)) {
                    error = true;
                    throw std::runtime_error("character out of range during base 85 decode");
                } else {
                    this->inbuf[this->pos++] = buf[i];
                    if (pos == 5) {
                        flush();
                    }
                }
                break;
            }
        }
    }
}